

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvoidReinterprets.cpp
# Opt level: O0

void __thiscall wasm::AvoidReinterprets::optimize(AvoidReinterprets *this,Function *func)

{
  LocalGraph *localGraph;
  size_t func_00;
  bool bVar1;
  Index IVar2;
  reference __in;
  type *__x;
  type *ptVar3;
  Memory *pMVar4;
  Type type;
  reference ppLVar5;
  Module *pMVar6;
  PassOptions *passOptions;
  undefined1 local_1e0 [8];
  FinalOptimizer finalOptimizer;
  Load *load_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_> *__range2_1;
  Memory *mem;
  type *info;
  type *load;
  _Self local_60;
  iterator __end2;
  iterator __begin2;
  map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
  *__range2;
  set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_> unoptimizables;
  Function *func_local;
  AvoidReinterprets *this_local;
  
  unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)func;
  std::set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_>::set
            ((set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_> *)&__range2)
  ;
  __end2 = std::
           map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
           ::begin(&this->infos);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
       ::end(&this->infos);
  while (bVar1 = std::operator!=(&__end2,&local_60), bVar1) {
    __in = std::_Rb_tree_iterator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>::
           operator*(&__end2);
    __x = std::get<0ul,wasm::Load*const,wasm::AvoidReinterprets::Info>(__in);
    ptVar3 = std::get<1ul,wasm::Load*const,wasm::AvoidReinterprets::Info>(__in);
    if (((ptVar3->reinterpreted & 1U) == 0) || (bVar1 = canReplaceWithReinterpret(*__x), !bVar1)) {
      std::set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_>::insert
                ((set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_> *)
                 &__range2,__x);
    }
    else {
      pMVar6 = Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>::
               getModule(&(this->
                          super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                          ).
                          super_PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                          .
                          super_Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                        );
      pMVar4 = Module::getMemory(pMVar6,(Name)((*__x)->memory).super_IString.str);
      IVar2 = Builder::addVar((Function *)
                              unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count,
                              (Type)(pMVar4->addressType).id);
      func_00 = unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count;
      ptVar3->ptrLocal = IVar2;
      type = wasm::Type::reinterpret
                       (&((*__x)->super_SpecificExpression<(wasm::Expression::Id)12>).
                         super_Expression.type);
      IVar2 = Builder::addVar((Function *)func_00,type);
      ptVar3->reinterpretedLocal = IVar2;
    }
    std::_Rb_tree_iterator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>::operator++
              (&__end2);
  }
  __end2_1 = std::set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_>::begin
                       ((set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_> *
                        )&__range2);
  load_1 = (Load *)std::set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_>::
                   end((set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_> *)
                       &__range2);
  while (bVar1 = std::operator!=(&__end2_1,(_Self *)&load_1), bVar1) {
    ppLVar5 = std::_Rb_tree_const_iterator<wasm::Load_*>::operator*(&__end2_1);
    finalOptimizer.passOptions = (PassOptions *)*ppLVar5;
    std::
    map<wasm::Load_*,_wasm::AvoidReinterprets::Info,_std::less<wasm::Load_*>,_std::allocator<std::pair<wasm::Load_*const,_wasm::AvoidReinterprets::Info>_>_>
    ::erase(&this->infos,(key_type *)&finalOptimizer.passOptions);
    std::_Rb_tree_const_iterator<wasm::Load_*>::operator++(&__end2_1);
  }
  localGraph = this->localGraph;
  pMVar6 = Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                       ).
                       super_PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                       .
                       super_Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                     );
  passOptions = Pass::getPassOptions((Pass *)this);
  optimize(wasm::Function*)::FinalOptimizer::FinalOptimizer(std::map<wasm::Load*,wasm::
  AvoidReinterprets::Info,std::less<wasm::Load*>,std::allocator<std::pair<wasm::Load*const,wasm::
  AvoidReinterprets::Info>>>&,wasm::LocalGraph*,wasm::Module*,wasm::PassOptions_const__
            (local_1e0,&this->infos,localGraph,pMVar6,passOptions);
  pMVar6 = Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>::getModule
                     (&(this->
                       super_WalkerPass<wasm::PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>_>
                       ).
                       super_PostWalker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                       .
                       super_Walker<wasm::AvoidReinterprets,_wasm::Visitor<wasm::AvoidReinterprets,_void>_>
                     );
  Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::setModule
            ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)local_1e0,pMVar6);
  Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_>::walk
            ((Walker<FinalOptimizer,_wasm::Visitor<FinalOptimizer,_void>_> *)local_1e0,
             (Expression **)(unoptimizables._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x60)
            );
  optimize::FinalOptimizer::~FinalOptimizer((FinalOptimizer *)local_1e0);
  std::set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_>::~set
            ((set<wasm::Load_*,_std::less<wasm::Load_*>,_std::allocator<wasm::Load_*>_> *)&__range2)
  ;
  return;
}

Assistant:

void optimize(Function* func) {
    std::set<Load*> unoptimizables;
    for (auto& [load, info] : infos) {
      if (info.reinterpreted && canReplaceWithReinterpret(load)) {
        // We should use another load here, to avoid reinterprets.
        auto mem = getModule()->getMemory(load->memory);
        info.ptrLocal = Builder::addVar(func, mem->addressType);
        info.reinterpretedLocal =
          Builder::addVar(func, load->type.reinterpret());
      } else {
        unoptimizables.insert(load);
      }
    }
    for (auto* load : unoptimizables) {
      infos.erase(load);
    }
    // We now know which we can optimize, and how.
    struct FinalOptimizer : public PostWalker<FinalOptimizer> {
      std::map<Load*, Info>& infos;
      LocalGraph* localGraph;
      Module* module;
      const PassOptions& passOptions;

      FinalOptimizer(std::map<Load*, Info>& infos,
                     LocalGraph* localGraph,
                     Module* module,
                     const PassOptions& passOptions)
        : infos(infos), localGraph(localGraph), module(module),
          passOptions(passOptions) {}

      void visitUnary(Unary* curr) {
        if (isReinterpret(curr)) {
          auto* value = curr->value;
          if (auto* load = value->dynCast<Load>()) {
            // A reinterpret of a load - flip it right here if we can.
            if (canReplaceWithReinterpret(load)) {
              replaceCurrent(makeReinterpretedLoad(load, load->ptr));
            }
          } else if (auto* get = value->dynCast<LocalGet>()) {
            if (auto* load =
                  getSingleLoad(localGraph, get, passOptions, *module)) {
              auto iter = infos.find(load);
              if (iter != infos.end()) {
                auto& info = iter->second;
                // A reinterpret of a get of a load - use the new local.
                Builder builder(*module);
                replaceCurrent(builder.makeLocalGet(info.reinterpretedLocal,
                                                    load->type.reinterpret()));
              }
            }
          }
        }
      }

      void visitLoad(Load* curr) {
        auto iter = infos.find(curr);
        if (iter != infos.end()) {
          auto& info = iter->second;
          Builder builder(*module);
          auto* ptr = curr->ptr;
          auto mem = getModule()->getMemory(curr->memory);
          auto addressType = mem->addressType;
          curr->ptr = builder.makeLocalGet(info.ptrLocal, addressType);
          // Note that the other load can have its sign set to false - if the
          // original were an integer, the other is a float anyhow; and if
          // original were a float, we don't know what sign to use.
          replaceCurrent(builder.makeBlock(
            {builder.makeLocalSet(info.ptrLocal, ptr),
             builder.makeLocalSet(
               info.reinterpretedLocal,
               makeReinterpretedLoad(
                 curr, builder.makeLocalGet(info.ptrLocal, addressType))),
             curr}));
        }
      }

      Load* makeReinterpretedLoad(Load* load, Expression* ptr) {
        Builder builder(*module);
        return builder.makeLoad(load->bytes,
                                false,
                                load->offset,
                                load->align,
                                ptr,
                                load->type.reinterpret(),
                                load->memory);
      }
    } finalOptimizer(infos, localGraph, getModule(), getPassOptions());

    finalOptimizer.setModule(getModule());
    finalOptimizer.walk(func->body);
  }